

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O0

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
::~sherwood_v3_table
          (sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
           *this)

{
  sherwood_v3_table<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_slang::parsing::TokenKind,_std::hash<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueHasher<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::hash<slang::parsing::TokenKind>_>,_std::equal_to<slang::parsing::TokenKind>,_ska::detailv3::KeyOrValueEquality<slang::parsing::TokenKind,_std::pair<slang::parsing::TokenKind,_slang::parsing::Token>,_std::equal_to<slang::parsing::TokenKind>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::parsing::TokenKind,_slang::parsing::Token>_>,_4UL>_>
  *this_local;
  
  clear(this);
  deallocate_data(this,this->entries,this->num_slots_minus_one,this->max_lookups);
  return;
}

Assistant:

~sherwood_v3_table()
    {
        clear();
        deallocate_data(entries, num_slots_minus_one, max_lookups);
    }